

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

bool __thiscall
basisu::etc1_optimizer::check_for_redundant_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  
  uVar1 = hash_hsieh((uint8_t *)coords,3);
  uVar2 = uVar1 >> 10;
  uVar4 = uVar1 >> 3 & 0x7f;
  if ((this->m_solutions_tried[uVar4] >> (uVar1 & 7) & 1) == 0) {
    bVar5 = (byte)(1 << ((byte)uVar2 & 7));
    uVar3 = (ulong)((uVar2 & 0x3ff) >> 3);
  }
  else {
    bVar5 = (byte)(1 << ((byte)uVar2 & 7));
    uVar3 = (ulong)((uVar2 & 0x3ff) >> 3);
    if ((this->m_solutions_tried[uVar3] >> (uVar2 & 7) & 1) != 0) {
      return false;
    }
  }
  this->m_solutions_tried[uVar4] = (byte)(1 << ((byte)uVar1 & 7)) | this->m_solutions_tried[uVar4];
  this->m_solutions_tried[uVar3] = this->m_solutions_tried[uVar3] | bVar5;
  return true;
}

Assistant:

bool etc1_optimizer::check_for_redundant_solution(const etc1_solution_coordinates& coords)
	{
		// Hash first 3 bytes of color (RGB)
		uint32_t kh = hash_hsieh((uint8_t*)&coords.m_unscaled_color.r, 3);

		uint32_t h0 = kh & cSolutionsTriedHashMask;
		uint32_t h1 = (kh >> cSolutionsTriedHashBits) & cSolutionsTriedHashMask;

		// Simple Bloom filter lookup with k=2
		if ( ((m_solutions_tried[h0 >> 3] & (1 << (h0 & 7))) != 0) &&
		     ((m_solutions_tried[h1 >> 3] & (1 << (h1 & 7))) != 0) )
			return false;

		m_solutions_tried[h0 >> 3] |= (1 << (h0 & 7));
		m_solutions_tried[h1 >> 3] |= (1 << (h1 & 7));

		return true;
	}